

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_y_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined1 (*pauVar1) [16];
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  CONV_BUF_TYPE *pCVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  char cVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined2 uVar19;
  int iVar20;
  uint16_t *puVar21;
  undefined2 uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  uint16_t *puVar29;
  CONV_BUF_TYPE *pCVar30;
  int iVar31;
  CONV_BUF_TYPE *pCVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  uint16_t *puVar36;
  int iVar37;
  uint16_t *puVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar55 [64];
  __m256i coeffs_y [4];
  undefined1 local_220 [32];
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar41 [32];
  
  iVar20 = conv_params->round_1 + conv_params->round_0;
  cVar11 = (char)bd - (char)iVar20;
  iVar31 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
  iVar37 = (1 << (cVar11 + 0xdU & 0x1f)) + (1 << (cVar11 + 0xeU & 0x1f));
  uVar23 = 0xe - iVar20;
  lVar35 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
  uVar22 = 0xff;
  if (bd == 0xc) {
    uVar22 = 0xfff;
  }
  uVar19 = 0x3ff;
  if (bd != 10) {
    uVar19 = uVar22;
  }
  auVar43 = ZEXT416(7 - conv_params->round_0);
  iVar20 = conv_params->fwd_offset;
  iVar2 = conv_params->bck_offset;
  uVar3 = conv_params->round_1;
  pCVar7 = conv_params->dst;
  lVar33 = (long)conv_params->dst_stride;
  iVar5 = conv_params->do_average;
  iVar6 = conv_params->use_dist_wtd_comp_avg;
  auVar51 = ZEXT1664(in_ZMM14._0_16_);
  prepare_coeffs(filter_params_y,subpel_y_qn,(__m256i *)&local_e0);
  lVar24 = (long)src_stride;
  iVar27 = ((1 << ((byte)uVar23 & 0x1f)) >> 1) - iVar37;
  lVar34 = (long)dst_stride0;
  lVar25 = 0;
  for (lVar26 = 0; lVar26 < w; lVar26 = lVar26 + 8) {
    pauVar1 = (undefined1 (*) [16])(src + (lVar26 - lVar35));
    auVar44 = *(undefined1 (*) [16])(*pauVar1 + lVar24 * 2);
    auVar42._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * *pauVar1;
    auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar44;
    auVar4 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 2) * 2);
    auVar46._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar44;
    auVar46._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
    auVar44 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 3) * 2);
    auVar49._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar4;
    auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar44;
    auVar4 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 4) * 2);
    auVar52._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar44;
    auVar52._16_16_ = ZEXT116(1) * auVar4;
    auVar44 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 5) * 2);
    auVar53._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar4;
    auVar53._16_16_ = ZEXT116(1) * auVar44;
    auVar4 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 6) * 2);
    auVar55._0_16_ = ZEXT116(0) * auVar42._0_16_ + ZEXT116(1) * auVar4;
    auVar55._32_32_ = auVar51._32_32_;
    auVar55._16_16_ = ZEXT116(1) * auVar42._0_16_;
    auVar54._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar44;
    auVar54._16_16_ = ZEXT116(1) * auVar4;
    auVar51 = ZEXT3264(CONCAT824(lStack_c8,CONCAT816(lStack_d0,CONCAT88(lStack_d8,local_e0))));
    auVar50 = vpunpcklwd_avx2(auVar42,auVar46);
    auVar8 = vpunpcklwd_avx2(auVar49,auVar52);
    auVar9 = vpunpcklwd_avx2(auVar53,auVar54);
    auVar42 = vpunpckhwd_avx2(auVar42,auVar46);
    local_220 = vpunpckhwd_avx2(auVar49,auVar52);
    auVar46 = vpunpckhwd_avx2(auVar53,auVar54);
    puVar21 = dst0 + lVar34;
    puVar29 = dst0;
    pCVar30 = pCVar7;
    pCVar32 = pCVar7 + lVar33;
    puVar36 = src + (src_stride * 8 - lVar35);
    puVar38 = src + (src_stride * 7 - lVar35);
    for (lVar28 = 0; auVar49 = auVar46, auVar52 = auVar8, lVar28 < h; lVar28 = lVar28 + 2) {
      auVar44 = *(undefined1 (*) [16])((long)puVar38 + lVar25);
      auVar47._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar55._0_16_;
      auVar47._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar44;
      auVar4 = *(undefined1 (*) [16])((long)puVar36 + lVar25);
      auVar40._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar44;
      auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
      auVar53 = vpunpcklwd_avx2(auVar47,auVar40);
      auVar46 = vpmaddwd_avx2(auVar50,auVar51._0_32_);
      auVar50 = vpmaddwd_avx2(auVar52,local_c0);
      auVar46 = vpaddd_avx2(auVar50,auVar46);
      auVar50 = vpmaddwd_avx2(auVar9,local_a0);
      auVar46 = vpaddd_avx2(auVar50,auVar46);
      auVar50 = vpmaddwd_avx2(auVar53,local_80);
      auVar46 = vpaddd_avx2(auVar50,auVar46);
      auVar50 = vpslld_avx2(auVar46,auVar43);
      auVar46 = vpunpckhwd_avx2(auVar47,auVar40);
      auVar18._4_4_ = iVar31;
      auVar18._0_4_ = iVar31;
      auVar18._8_4_ = iVar31;
      auVar18._12_4_ = iVar31;
      auVar18._16_4_ = iVar31;
      auVar18._20_4_ = iVar31;
      auVar18._24_4_ = iVar31;
      auVar18._28_4_ = iVar31;
      auVar50 = vpaddd_avx2(auVar50,auVar18);
      auVar50 = vpsrad_avx2(auVar50,ZEXT416(uVar3));
      auVar10._4_4_ = iVar37;
      auVar10._0_4_ = iVar37;
      auVar10._8_4_ = iVar37;
      auVar10._12_4_ = iVar37;
      auVar10._16_4_ = iVar37;
      auVar10._20_4_ = iVar37;
      auVar10._24_4_ = iVar37;
      auVar10._28_4_ = iVar37;
      auVar50 = vpaddd_avx2(auVar50,auVar10);
      auVar8._4_4_ = iVar2;
      auVar8._0_4_ = iVar2;
      auVar8._8_4_ = iVar2;
      auVar8._12_4_ = iVar2;
      auVar8._16_4_ = iVar2;
      auVar8._20_4_ = iVar2;
      auVar8._24_4_ = iVar2;
      auVar8._28_4_ = iVar2;
      auVar8 = vpmulld_avx2(auVar50,auVar8);
      auVar44 = ZEXT416(uVar23);
      if ((long)w + -8 < lVar26) {
        if (iVar5 == 0) {
          auVar42 = vpackusdw_avx2(auVar50,auVar10);
          *(long *)((long)pCVar30 + lVar25) = auVar42._0_8_;
          *(long *)((long)pCVar32 + lVar25) = auVar42._16_8_;
        }
        else {
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)((long)pCVar32 + lVar25);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)((long)pCVar30 + lVar25);
          auVar41._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar45;
          auVar41._16_16_ = ZEXT116(1) * auVar39;
          auVar42 = vpunpcklwd_avx2(auVar41,_DAT_0046f620);
          if (iVar6 == 0) {
            auVar42 = vpaddd_avx2(auVar50,auVar42);
            auVar42 = vpsrad_avx2(auVar42,1);
          }
          else {
            auVar12._4_4_ = iVar20;
            auVar12._0_4_ = iVar20;
            auVar12._8_4_ = iVar20;
            auVar12._12_4_ = iVar20;
            auVar12._16_4_ = iVar20;
            auVar12._20_4_ = iVar20;
            auVar12._24_4_ = iVar20;
            auVar12._28_4_ = iVar20;
            auVar42 = vpmulld_avx2(auVar42,auVar12);
            auVar42 = vpaddd_avx2(auVar42,auVar8);
            auVar42 = vpsrad_avx2(auVar42,4);
          }
          auVar14._4_4_ = iVar27;
          auVar14._0_4_ = iVar27;
          auVar14._8_4_ = iVar27;
          auVar14._12_4_ = iVar27;
          auVar14._16_4_ = iVar27;
          auVar14._20_4_ = iVar27;
          auVar14._24_4_ = iVar27;
          auVar14._28_4_ = iVar27;
          auVar42 = vpaddd_avx2(auVar42,auVar14);
          auVar42 = vpsrad_avx2(auVar42,auVar44);
          auVar42 = vpackusdw_avx2(auVar42,auVar42);
          auVar16._2_2_ = uVar19;
          auVar16._0_2_ = uVar19;
          auVar16._4_2_ = uVar19;
          auVar16._6_2_ = uVar19;
          auVar16._8_2_ = uVar19;
          auVar16._10_2_ = uVar19;
          auVar16._12_2_ = uVar19;
          auVar16._14_2_ = uVar19;
          auVar16._16_2_ = uVar19;
          auVar16._18_2_ = uVar19;
          auVar16._20_2_ = uVar19;
          auVar16._22_2_ = uVar19;
          auVar16._24_2_ = uVar19;
          auVar16._26_2_ = uVar19;
          auVar16._28_2_ = uVar19;
          auVar16._30_2_ = uVar19;
          auVar42 = vpminsw_avx2(auVar42,auVar16);
          *(long *)((long)puVar29 + lVar25) = auVar42._0_8_;
          *(long *)((long)puVar21 + lVar25) = auVar42._16_8_;
        }
      }
      else {
        auVar42 = vpmaddwd_avx2(auVar42,auVar51._0_32_);
        auVar54 = vpmaddwd_avx2(local_c0,local_220);
        auVar42 = vpaddd_avx2(auVar54,auVar42);
        auVar54 = vpmaddwd_avx2(auVar49,local_a0);
        auVar42 = vpaddd_avx2(auVar42,auVar54);
        auVar54 = vpmaddwd_avx2(auVar46,local_80);
        auVar42 = vpaddd_avx2(auVar42,auVar54);
        auVar42 = vpslld_avx2(auVar42,auVar43);
        auVar42 = vpaddd_avx2(auVar42,auVar18);
        auVar42 = vpsrad_avx2(auVar42,ZEXT416(uVar3));
        auVar42 = vpaddd_avx2(auVar42,auVar10);
        if (iVar5 == 0) {
          auVar42 = vpackusdw_avx2(auVar50,auVar42);
          *(undefined1 (*) [16])((long)pCVar30 + lVar25) = auVar42._0_16_;
          *(undefined1 (*) [16])((long)pCVar32 + lVar25) = auVar42._16_16_;
          auVar51 = ZEXT3264(CONCAT824(lStack_c8,CONCAT816(lStack_d0,CONCAT88(lStack_d8,local_e0))))
          ;
        }
        else {
          auVar48._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])((long)pCVar32 + lVar25) +
               ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar30 + lVar25);
          auVar48._16_16_ = ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar32 + lVar25);
          auVar10 = vpunpcklwd_avx2(auVar48,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar54 = vpunpckhwd_avx2(auVar48,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          if (iVar6 == 0) {
            auVar50 = vpaddd_avx2(auVar50,auVar10);
            auVar50 = vpsrad_avx2(auVar50,1);
            auVar42 = vpaddd_avx2(auVar42,auVar54);
            auVar42 = vpsrad_avx2(auVar42,1);
          }
          else {
            auVar13._4_4_ = iVar20;
            auVar13._0_4_ = iVar20;
            auVar13._8_4_ = iVar20;
            auVar13._12_4_ = iVar20;
            auVar13._16_4_ = iVar20;
            auVar13._20_4_ = iVar20;
            auVar13._24_4_ = iVar20;
            auVar13._28_4_ = iVar20;
            auVar50 = vpmulld_avx2(auVar13,auVar10);
            auVar50 = vpaddd_avx2(auVar50,auVar8);
            auVar50 = vpsrad_avx2(auVar50,4);
            auVar8 = vpmulld_avx2(auVar13,auVar54);
            auVar17._4_4_ = iVar2;
            auVar17._0_4_ = iVar2;
            auVar17._8_4_ = iVar2;
            auVar17._12_4_ = iVar2;
            auVar17._16_4_ = iVar2;
            auVar17._20_4_ = iVar2;
            auVar17._24_4_ = iVar2;
            auVar17._28_4_ = iVar2;
            auVar42 = vpmulld_avx2(auVar42,auVar17);
            auVar42 = vpaddd_avx2(auVar8,auVar42);
            auVar42 = vpsrad_avx2(auVar42,4);
          }
          auVar51 = ZEXT3264(CONCAT824(lStack_c8,CONCAT816(lStack_d0,CONCAT88(lStack_d8,local_e0))))
          ;
          auVar15._4_4_ = iVar27;
          auVar15._0_4_ = iVar27;
          auVar15._8_4_ = iVar27;
          auVar15._12_4_ = iVar27;
          auVar15._16_4_ = iVar27;
          auVar15._20_4_ = iVar27;
          auVar15._24_4_ = iVar27;
          auVar15._28_4_ = iVar27;
          auVar50 = vpaddd_avx2(auVar15,auVar50);
          auVar50 = vpsrad_avx2(auVar50,auVar44);
          auVar42 = vpaddd_avx2(auVar42,auVar15);
          auVar42 = vpsrad_avx2(auVar42,auVar44);
          auVar42 = vpackusdw_avx2(auVar50,auVar42);
          auVar50._2_2_ = uVar19;
          auVar50._0_2_ = uVar19;
          auVar50._4_2_ = uVar19;
          auVar50._6_2_ = uVar19;
          auVar50._8_2_ = uVar19;
          auVar50._10_2_ = uVar19;
          auVar50._12_2_ = uVar19;
          auVar50._14_2_ = uVar19;
          auVar50._16_2_ = uVar19;
          auVar50._18_2_ = uVar19;
          auVar50._20_2_ = uVar19;
          auVar50._22_2_ = uVar19;
          auVar50._24_2_ = uVar19;
          auVar50._26_2_ = uVar19;
          auVar50._28_2_ = uVar19;
          auVar50._30_2_ = uVar19;
          auVar42 = vpminsw_avx2(auVar42,auVar50);
          *(undefined1 (*) [16])((long)puVar29 + lVar25) = auVar42._0_16_;
          *(undefined1 (*) [16])((long)puVar21 + lVar25) = auVar42._16_16_;
        }
      }
      auVar55 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar4,ZEXT116(0) * auVar4 + ZEXT116(1) * auVar4));
      puVar36 = puVar36 + lVar24 * 2;
      puVar38 = puVar38 + lVar24 * 2;
      pCVar32 = pCVar32 + lVar33 * 2;
      pCVar30 = pCVar30 + lVar33 * 2;
      puVar21 = puVar21 + lVar34 * 2;
      puVar29 = puVar29 + lVar34 * 2;
      auVar8 = auVar9;
      auVar42 = local_220;
      auVar50 = auVar52;
      auVar9 = auVar53;
      local_220 = auVar49;
    }
    lVar25 = lVar25 + 0x10;
    auVar51 = auVar55;
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  int i, j;
  __m256i s[8], coeffs_y[4];
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i round_const_y =
      _mm256_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m256i src6;
      __m256i s01 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 0 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          0x20);
      __m256i s12 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          0x20);
      __m256i s23 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          0x20);
      __m256i s34 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          0x20);
      __m256i s45 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          0x20);
      src6 = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)(data + 6 * src_stride)));
      __m256i s56 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          src6, 0x20);

      s[0] = _mm256_unpacklo_epi16(s01, s12);
      s[1] = _mm256_unpacklo_epi16(s23, s34);
      s[2] = _mm256_unpacklo_epi16(s45, s56);

      s[4] = _mm256_unpackhi_epi16(s01, s12);
      s[5] = _mm256_unpackhi_epi16(s23, s34);
      s[6] = _mm256_unpackhi_epi16(s45, s56);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        const __m256i s67 = _mm256_permute2x128_si256(
            src6,
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + 8 * src_stride)));

        const __m256i s78 = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            src6, 0x20);

        s[3] = _mm256_unpacklo_epi16(s67, s78);
        s[7] = _mm256_unpackhi_epi16(s67, s78);

        const __m256i res_a = convolve(s, coeffs_y);

        __m256i res_a_round = _mm256_sll_epi32(res_a, round_shift_bits);
        res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a_round, round_const_y), round_shift_y);

        __m256i res_unsigned_lo = _mm256_add_epi32(res_a_round, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sll_epi32(res_b, round_shift_bits);
          res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b_round, round_const_y), round_shift_y);

          __m256i res_unsigned_hi = _mm256_add_epi32(res_b_round, offset_const);

          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);
            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}